

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::pid_formatter<spdlog::details::null_scoped_padder>::format
          (pid_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  byte abStack_1a [5];
  undefined2 local_15;
  char local_13 [3];
  char *local_10;
  
  uVar2 = getpid();
  pcVar4 = local_13;
  uVar3 = uVar2;
  if (99 < uVar2) {
    do {
      uVar3 = uVar2 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)(&::fmt::v7::detail::basic_data<void>::digits + (ulong)(uVar2 % 100) * 2);
      pcVar4 = pcVar4 + -2;
      bVar1 = 9999 < uVar2;
      uVar2 = uVar2 / 100;
    } while (bVar1);
  }
  if (uVar3 < 10) {
    pcVar4[-1] = (byte)uVar3 | 0x30;
    local_10 = pcVar4 + -1;
  }
  else {
    *(undefined2 *)(pcVar4 + -2) =
         *(undefined2 *)(&::fmt::v7::detail::basic_data<void>::digits + (ulong)uVar3 * 2);
    local_10 = pcVar4 + -2;
  }
  ::fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_10,local_13);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = ScopedPadder::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }